

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::Namespace::Namespace
          (Namespace *this,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (processorKeyword->sourceCode).object;
  if (local_18.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_18.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_18.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_18.location.data = (processorKeyword->location).data;
  ModuleBase::ModuleBase(&this->super_ModuleBase,Namespace,&local_18,processorName,moduleName);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18.sourceCode);
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject = (_func_int **)&PTR__Namespace_0032d5b0;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__Namespace_0032d688;
  (this->importsList).imports.items =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->importsList).imports.space;
  (this->importsList).imports.numActive = 0;
  (this->importsList).imports.numAllocated = 4;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subModules).
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subModules).
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subModules).
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->constants).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constants).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constants).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->namespaceInstances).
  super__Vector_base<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namespaceInstances).
  super__Vector_base<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namespaceInstances).
  super__Vector_base<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Namespace (CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ModuleBase (ObjectType::Namespace, processorKeyword, processorName, moduleName) {}